

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

Bitmap __thiscall lunasvg::loadImageResource(lunasvg *this,string *href)

{
  int iVar1;
  size_type sVar2;
  const_pointer data;
  size_type sVar3;
  plutovg_surface_t *ppVar4;
  char *filename;
  undefined1 auVar5 [16];
  size_type index;
  string_view input;
  string *href_local;
  
  input._M_str = (char *)href;
  iVar1 = std::__cxx11::string::compare((ulong)href,0,(char *)0x5);
  if (iVar1 == 0) {
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)input._M_str);
    input._M_len = auVar5._8_8_;
    index = auVar5._0_8_;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)&index,',',5);
    if (sVar2 == 0xffffffffffffffff) {
      memset(this,0,8);
      Bitmap::Bitmap((Bitmap *)this);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&index,sVar2 + 1);
      data = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&index);
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&index);
      ppVar4 = plutovg_surface_load_from_image_base64(data,(int)sVar3);
      Bitmap::Bitmap((Bitmap *)this,ppVar4);
    }
  }
  else {
    filename = (char *)std::__cxx11::string::data();
    ppVar4 = plutovg_surface_load_from_image_file(filename);
    Bitmap::Bitmap((Bitmap *)this,ppVar4);
  }
  return (Bitmap)(plutovg_surface_t *)this;
}

Assistant:

static Bitmap loadImageResource(const std::string& href)
{
    if(href.compare(0, 5, "data:") == 0) {
        std::string_view input(href);
        auto index = input.find(',', 5);
        if(index == std::string_view::npos)
            return Bitmap();
        input.remove_prefix(index + 1);
        return plutovg_surface_load_from_image_base64(input.data(), input.length());
    }

    return plutovg_surface_load_from_image_file(href.data());
}